

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint *puVar1;
  string *s;
  size_t __n;
  void *pvVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint8 *puVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint *puVar11;
  long lVar12;
  
  uVar9 = (this->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    *target = 10;
    pbVar7 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar7;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = target + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    target = target + 2;
    *pbVar7 = (byte)uVar9;
    puVar11 = (uint *)(this->path_).arena_or_elements_;
    puVar1 = puVar11 + (this->path_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = *puVar11;
      if ((ulong)(long)(int)uVar9 < 0x80) {
        *target = (byte)uVar9;
        target = target + 1;
      }
      else {
        *target = (byte)uVar9 | 0x80;
        uVar4 = (ulong)(long)(int)uVar9 >> 7;
        if (uVar9 < 0x4000) {
          target[1] = (byte)uVar4;
          target = target + 2;
        }
        else {
          target = target + 2;
          do {
            pbVar7 = target;
            pbVar7[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            target = pbVar7 + 1;
            bVar3 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar3);
          *pbVar7 = (byte)uVar5;
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 < puVar1);
  }
  uVar9 = (this->_span_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    *target = 0x12;
    pbVar7 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar7;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = target + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    target = target + 2;
    *pbVar7 = (byte)uVar9;
    puVar11 = (uint *)(this->span_).arena_or_elements_;
    puVar1 = puVar11 + (this->span_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = *puVar11;
      if ((ulong)(long)(int)uVar9 < 0x80) {
        *target = (byte)uVar9;
        target = target + 1;
      }
      else {
        *target = (byte)uVar9 | 0x80;
        uVar4 = (ulong)(long)(int)uVar9 >> 7;
        if (uVar9 < 0x4000) {
          target[1] = (byte)uVar4;
          target = target + 2;
        }
        else {
          target = target + 2;
          do {
            pbVar7 = target;
            pbVar7[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            target = pbVar7 + 1;
            bVar3 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar3);
          *pbVar7 = (byte)uVar5;
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 < puVar1);
  }
  uVar9 = (this->_has_bits_).has_bits_[0];
  if ((uVar9 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(this->leading_comments_).ptr_,target);
  }
  if ((uVar9 & 2) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,4,(this->trailing_comments_).ptr_,target);
  }
  lVar12 = (long)(this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar12) {
    lVar10 = 0;
    do {
      s = (string *)
          ((this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_)->elements[lVar10];
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 0x32;
        target[1] = (byte)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,6,s,target);
      }
      lVar10 = lVar10 + 1;
    } while (lVar12 != lVar10);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  // repeated int32 span = 2 [packed = true];
  {
    int byte_size = _span_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, _internal_span(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string leading_comments = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_leading_comments().data(), static_cast<int>(this->_internal_leading_comments().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_trailing_comments().data(), static_cast<int>(this->_internal_trailing_comments().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_trailing_comments(), target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this->_internal_leading_detached_comments_size(); i < n; i++) {
    const auto& s = this->_internal_leading_detached_comments(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = stream->WriteString(6, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}